

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::
SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
::cleanup(SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
          *this,EVP_PKEY_CTX *ctx)

{
  pointer this_00;
  long lVar1;
  
  this_00 = this->data_;
  for (lVar1 = this->len << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    anon_unknown.dwarf_965823::Constructable::~Constructable(&this_00->second);
    anon_unknown.dwarf_965823::Constructable::~Constructable(&this_00->first);
    this_00 = this_00 + 1;
  }
  if (this->data_ != (pointer)this->firstElement) {
    operator_delete(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }